

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmInstruction *inst)

{
  SmallArray<VmValue_*,_4U> *this;
  VmValue *pVVar1;
  VmValue *this_00;
  VmValue **ppVVar2;
  uint i;
  uint uVar3;
  
  if ((((inst->super_VmValue).users.count == 0) && ((inst->super_VmValue).hasSideEffects == false))
     && ((inst->super_VmValue).canBeRemoved == true)) {
    module->deadCodeEliminations = module->deadCodeEliminations + 1;
    if (inst->parent != (VmBlock *)0x0) {
      VmBlock::RemoveInstruction(inst->parent,inst);
      return;
    }
  }
  else if (inst->cmd - VM_INST_JUMP_Z < 2) {
    ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
    pVVar1 = *ppVVar2;
    if ((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 1)) {
      if (inst->cmd == VM_INST_JUMP_Z) {
        uVar3 = 2 - (*(int *)&pVVar1[1]._vptr_VmValue == 0);
      }
      else {
        uVar3 = (*(int *)&pVVar1[1]._vptr_VmValue == 0) + 1;
      }
      ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,uVar3);
      anon_unknown.dwarf_11cad6::ChangeInstructionTo
                (module,inst,VM_INST_JUMP,*ppVVar2,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                 (VmValue *)0x0,&module->deadCodeEliminations);
    }
  }
  else if (inst->cmd == VM_INST_PHI) {
    this = &inst->arguments;
    uVar3 = 0;
    do {
      while( true ) {
        if ((inst->arguments).count <= uVar3) {
          return;
        }
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](this,uVar3);
        pVVar1 = *ppVVar2;
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](this,uVar3 | 1);
        this_00 = *ppVVar2;
        if (((this_00->users).count != 1) ||
           (ppVVar2 = SmallArray<VmValue_*,_8U>::operator[](&this_00->users,0),
           (VmInstruction *)*ppVVar2 != inst)) break;
        VmValue::RemoveUse(pVVar1,&inst->super_VmValue);
        VmValue::RemoveUse(this_00,&inst->super_VmValue);
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](this,(inst->arguments).count - 2);
        pVVar1 = *ppVVar2;
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](this,uVar3);
        *ppVVar2 = pVVar1;
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](this,(inst->arguments).count - 1);
        pVVar1 = *ppVVar2;
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](this,uVar3 | 1);
        *ppVVar2 = pVVar1;
        SmallArray<VmValue_*,_4U>::pop_back(this);
        SmallArray<VmValue_*,_4U>::pop_back(this);
      }
      uVar3 = uVar3 + 2;
    } while( true );
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmInstruction *inst)
{
	(void)ctx;

	if(inst->users.empty() && !inst->hasSideEffects && inst->canBeRemoved)
	{
		module->deadCodeEliminations++;

		if(inst->parent)
			inst->parent->RemoveInstruction(inst);
	}
	else if(inst->cmd == VM_INST_JUMP_Z || inst->cmd == VM_INST_JUMP_NZ)
	{
		// Remove conditional branches with constant condition
		if(VmConstant *condition = getType<VmConstant>(inst->arguments[0]))
		{
			if(inst->cmd == VM_INST_JUMP_Z)
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[1] : inst->arguments[2], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
			else
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[2] : inst->arguments[1], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
		}
	}
	else if(inst->cmd == VM_INST_PHI)
	{
		// Remove incoming branches that are never executed (phi instruction is the only user)
		for(unsigned i = 0; i < inst->arguments.size();)
		{
			VmValue *option = inst->arguments[i];
			VmValue *edge = inst->arguments[i + 1];

			if(edge->users.size() == 1 && edge->users[0] == inst)
			{
				option->RemoveUse(inst);
				edge->RemoveUse(inst);

				inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
				inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

				inst->arguments.pop_back();
				inst->arguments.pop_back();
			}
			else
			{
				i += 2;
			}
		}
	}
}